

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O0

bool __thiscall QMakeSourceFileInfo::mocable(QMakeSourceFileInfo *this,QString *file)

{
  long lVar1;
  SourceFile *pSVar2;
  long in_RDI;
  long in_FS_OFFSET;
  SourceFile *node;
  QString *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  QMakeLocalFileName *f;
  SourceFiles *in_stack_ffffffffffffffa0;
  bool local_39;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  f = *(QMakeLocalFileName **)(in_RDI + 8);
  QMakeLocalFileName::QMakeLocalFileName
            ((QMakeLocalFileName *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88);
  pSVar2 = SourceFiles::lookupFile(in_stack_ffffffffffffffa0,f);
  QMakeLocalFileName::~QMakeLocalFileName
            ((QMakeLocalFileName *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  if (pSVar2 == (SourceFile *)0x0) {
    local_39 = false;
  }
  else {
    local_39 = (pSVar2->field_0x3c & 1) != 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

bool QMakeSourceFileInfo::mocable(const QString &file)
{
    if(SourceFile *node = files->lookupFile(QMakeLocalFileName(file)))
        return node->mocable;
    return false;
}